

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

bool __thiscall Instance::solve(Instance *this)

{
  context *pcVar1;
  check_result cVar2;
  clock_t cVar3;
  clock_t cVar4;
  params p;
  params local_30;
  
  cVar3 = clock();
  (**this->_vptr_Instance)(this);
  cVar4 = clock();
  this->constraint_t = ((double)(cVar4 - cVar3) * 1000.0) / 1000000.0 + this->constraint_t;
  pcVar1 = this->c;
  local_30.super_object.m_ctx = pcVar1;
  local_30.m_params = (Z3_params)Z3_mk_params(pcVar1->m_ctx);
  Z3_params_inc_ref(pcVar1->m_ctx,local_30.m_params);
  z3::params::set(&local_30,":timeout",60000);
  Z3_optimize_set_params
            (((this->solver).super_object.m_ctx)->m_ctx,(this->solver).m_opt,local_30.m_params);
  z3::context::check_error((this->solver).super_object.m_ctx);
  cVar3 = clock();
  cVar2 = z3::optimize::check(&this->solver);
  cVar4 = clock();
  this->solve_t = ((double)(cVar4 - cVar3) * 1000.0) / 1000000.0 + this->solve_t;
  z3::params::~params(&local_30);
  return cVar2 == sat;
}

Assistant:

bool Instance::solve() {
  std::clock_t c_start = std::clock();
  enforceConstraints();
  std::clock_t c_end = std::clock();
  constraint_t += 1000.0 * (c_end - c_start) / CLOCKS_PER_SEC;

  z3::params p(*c);
  p.set(":timeout", static_cast<unsigned>(1000*60)); //1 minute timout
  solver.set(p);
  c_start = std::clock();
  bool result = solver.check() == sat;
  c_end = std::clock();
  solve_t += 1000.0 * (c_end - c_start) / CLOCKS_PER_SEC;
  return result;
}